

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib643.c
# Opt level: O1

size_t read_callback(char *ptr,size_t size,size_t nmemb,void *userp)

{
  int iVar1;
  size_t sVar2;
  
  iVar1 = read_callback::count + 1;
  sVar2 = 0x10000000;
  if (read_callback::count != 1) {
    if (read_callback::count != 0) {
      read_callback::count = iVar1;
      curl_mprintf("Wrongly called >2 times\n");
      exit(1);
    }
    read_callback::count = iVar1;
    *ptr = '\n';
    sVar2 = 1;
    iVar1 = read_callback::count;
  }
  read_callback::count = iVar1;
  return sVar2;
}

Assistant:

static size_t read_callback(char *ptr, size_t size, size_t nmemb, void *userp)
{
#ifdef LIB644
  static int count = 0;
  (void)ptr;
  (void)size;
  (void)nmemb;
  (void)userp;
  switch(count++) {
  case 0: /* Return a single byte. */
    *ptr = '\n';
    return 1;
  case 1: /* Request abort. */
    return CURL_READFUNC_ABORT;
  }
  printf("Wrongly called >2 times\n");
  exit(1); /* trigger major failure */
#else

  struct WriteThis *pooh = (struct WriteThis *)userp;
  int eof = !*pooh->readptr;

  if(size*nmemb < 1)
    return 0;

#ifndef LIB645
  eof = pooh->sizeleft <= 0;
  if(!eof)
    pooh->sizeleft--;
#endif

  if(!eof) {
    *ptr = *pooh->readptr;           /* copy one single byte */
    pooh->readptr++;                 /* advance pointer */
    return 1;                        /* we return 1 byte at a time! */
  }

  return 0;                         /* no more data left to deliver */
#endif
}